

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_endian.cpp
# Opt level: O0

spv_result_t spvBinaryEndianness(spv_const_binary binary,spv_endianness_t *pEndian)

{
  uint32_t uVar1;
  char local_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  uint8_t bytes [4];
  spv_endianness_t *pEndian_local;
  spv_const_binary binary_local;
  
  if ((binary->code == (uint32_t *)0x0) || (binary->wordCount == 0)) {
    binary_local._4_4_ = SPV_ERROR_INVALID_BINARY;
  }
  else if (pEndian == (spv_endianness_t *)0x0) {
    binary_local._4_4_ = SPV_ERROR_INVALID_POINTER;
  }
  else {
    uVar1 = *binary->code;
    local_24 = (char)uVar1;
    cStack_23 = (char)(uVar1 >> 8);
    cStack_22 = (char)(uVar1 >> 0x10);
    cStack_21 = (char)(uVar1 >> 0x18);
    if ((((local_24 == '\x03') && (cStack_23 == '\x02')) && (cStack_22 == '#')) &&
       (cStack_21 == '\a')) {
      *pEndian = SPV_ENDIANNESS_LITTLE;
      binary_local._4_4_ = SPV_SUCCESS;
    }
    else if (((local_24 == '\a') && (cStack_23 == '#')) &&
            ((cStack_22 == '\x02' && (cStack_21 == '\x03')))) {
      *pEndian = SPV_ENDIANNESS_BIG;
      binary_local._4_4_ = SPV_SUCCESS;
    }
    else {
      binary_local._4_4_ = SPV_ERROR_INVALID_BINARY;
    }
  }
  return binary_local._4_4_;
}

Assistant:

spv_result_t spvBinaryEndianness(spv_const_binary binary,
                                 spv_endianness_t* pEndian) {
  if (!binary->code || !binary->wordCount) return SPV_ERROR_INVALID_BINARY;
  if (!pEndian) return SPV_ERROR_INVALID_POINTER;

  uint8_t bytes[4];
  memcpy(bytes, binary->code, sizeof(uint32_t));

  if (0x03 == bytes[0] && 0x02 == bytes[1] && 0x23 == bytes[2] &&
      0x07 == bytes[3]) {
    *pEndian = SPV_ENDIANNESS_LITTLE;
    return SPV_SUCCESS;
  }

  if (0x07 == bytes[0] && 0x23 == bytes[1] && 0x02 == bytes[2] &&
      0x03 == bytes[3]) {
    *pEndian = SPV_ENDIANNESS_BIG;
    return SPV_SUCCESS;
  }

  return SPV_ERROR_INVALID_BINARY;
}